

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nds2sf.cpp
# Opt level: O0

bool NDS2SF::make_mini2sf
               (string *nds2sf_path,uint32_t address,size_t size,uint32_t num,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *tags)

{
  uint8_t local_148 [8];
  uint8_t exe [264];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *tags_local;
  uint32_t num_local;
  size_t size_local;
  uint32_t address_local;
  string *nds2sf_path_local;
  
  memset(local_148,0,0x108);
  if (size < 0x101) {
    put_2sf_exe_header(local_148,address,(uint32_t)size);
    mput4l(num,exe);
    nds2sf_path_local._7_1_ = exe2sf(nds2sf_path,local_148,size + 8,tags);
  }
  else {
    nds2sf_path_local._7_1_ = false;
  }
  return nds2sf_path_local._7_1_;
}

Assistant:

bool NDS2SF::make_mini2sf(const std::string& nds2sf_path, uint32_t address, size_t size, uint32_t num, std::map<std::string, std::string>& tags)
{
	uint8_t exe[NDS2SF_EXE_HEADER_SIZE + 256];
	memset(exe, 0, NDS2SF_EXE_HEADER_SIZE + 256);

	// limit size
	if (size > 256)
	{
		return false;
	}

	// make exe
	put_2sf_exe_header(exe, address, (uint32_t)size);
	mput4l(num, &exe[NDS2SF_EXE_HEADER_SIZE]);

	// write mini2sf file
	return exe2sf(nds2sf_path, exe, NDS2SF_EXE_HEADER_SIZE + size, tags);
}